

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.c
# Opt level: O0

LY_ERR ly_ctx_set_searchdir(ly_ctx *ctx,char *search_dir)

{
  lyd_node *plVar1;
  long lVar2;
  int iVar3;
  LY_ERR LVar4;
  int *piVar5;
  char *pcVar6;
  lys_module *local_118;
  lys_module *mod;
  uint64_t u;
  char *pcStack_c0;
  uint32_t i;
  char *new_dir;
  stat st;
  int rc;
  char *search_dir_local;
  ly_ctx *ctx_local;
  
  st.__glibc_reserved[2]._4_4_ = LY_SUCCESS;
  pcStack_c0 = (char *)0x0;
  if (ctx == (ly_ctx *)0x0) {
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).","ctx",
           "ly_ctx_set_searchdir");
    ctx_local._4_4_ = LY_EINVAL;
  }
  else {
    if (search_dir != (char *)0x0) {
      pcStack_c0 = realpath(search_dir,(char *)0x0);
      if (pcStack_c0 == (char *)0x0) {
        piVar5 = __errno_location();
        pcVar6 = strerror(*piVar5);
        ly_log(ctx,LY_LLERR,LY_ESYS,"Unable to use search directory \"%s\" (%s).",search_dir,pcVar6)
        ;
        st.__glibc_reserved[2]._4_4_ = LY_EINVAL;
      }
      else {
        iVar3 = strcmp(search_dir,pcStack_c0);
        if (iVar3 != 0) {
          ly_log((ly_ctx *)0x0,LY_LLVRB,LY_SUCCESS,
                 "Search directory string \"%s\" canonized to \"%s\".",search_dir,pcStack_c0);
        }
        iVar3 = access(pcStack_c0,5);
        if (iVar3 == 0) {
          iVar3 = stat(pcStack_c0,(stat *)&new_dir);
          if (iVar3 == 0) {
            if (((uint)st.st_nlink & 0xf000) == 0x4000) {
              for (u._4_4_ = 0; u._4_4_ < (ctx->search_paths).count; u._4_4_ = u._4_4_ + 1) {
                iVar3 = strcmp(pcStack_c0,(char *)(ctx->search_paths).field_2.dnodes[u._4_4_]);
                if (iVar3 == 0) {
                  st.__glibc_reserved[2]._4_4_ = LY_EEXIST;
                  goto LAB_001234fd;
                }
              }
              LVar4 = ly_set_add(&ctx->search_paths,pcStack_c0,'\x01',(uint32_t *)0x0);
              if (LVar4 == LY_SUCCESS) {
                for (u._4_4_ = 0; u._4_4_ < (ctx->list).count; u._4_4_ = u._4_4_ + 1) {
                  plVar1 = (ctx->list).field_2.dnodes[u._4_4_];
                  *(byte *)((long)&plVar1[2].schema + 2) =
                       *(byte *)((long)&plVar1[2].schema + 2) & 0xfd;
                  if ((plVar1[1].next != (lyd_node *)0x0) &&
                     ((plVar1[1].next)->next != (lyd_node *)0x0)) {
                    mod = (lys_module *)0x0;
                    while( true ) {
                      if ((plVar1[1].next)->next == (lyd_node *)0x0) {
                        local_118 = (lys_module *)0x0;
                      }
                      else {
                        local_118 = (lys_module *)(plVar1[1].next)->next[-1].priv;
                      }
                      if (local_118 <= mod) break;
                      lVar2 = *(long *)((plVar1[1].next)->next + (long)mod);
                      *(byte *)(lVar2 + 0x79) =
                           *(byte *)(lVar2 + 0x79) & 0xf3 | (*(byte *)(lVar2 + 0x79) >> 2 & 1) << 2;
                      mod = (lys_module *)((long)&mod->ctx + 1);
                    }
                  }
                }
              }
              else {
                st.__glibc_reserved[2]._4_4_ = LY_EMEM;
              }
            }
            else {
              ly_log(ctx,LY_LLERR,LY_ESYS,"Given search directory \"%s\" is not a directory.",
                     pcStack_c0);
              st.__glibc_reserved[2]._4_4_ = LY_EINVAL;
            }
          }
          else {
            piVar5 = __errno_location();
            pcVar6 = strerror(*piVar5);
            ly_log(ctx,LY_LLERR,LY_ESYS,"stat() failed for \"%s\" (%s).",pcStack_c0,pcVar6);
            st.__glibc_reserved[2]._4_4_ = LY_ESYS;
          }
        }
        else {
          piVar5 = __errno_location();
          pcVar6 = strerror(*piVar5);
          ly_log(ctx,LY_LLERR,LY_ESYS,"Unable to fully access search directory \"%s\" (%s).",
                 pcStack_c0,pcVar6);
          st.__glibc_reserved[2]._4_4_ = LY_EINVAL;
        }
      }
    }
LAB_001234fd:
    if (st.__glibc_reserved[2]._4_4_ != LY_SUCCESS) {
      free(pcStack_c0);
    }
    ctx_local._4_4_ = st.__glibc_reserved[2]._4_4_;
  }
  return ctx_local._4_4_;
}

Assistant:

LIBYANG_API_DEF LY_ERR
ly_ctx_set_searchdir(struct ly_ctx *ctx, const char *search_dir)
{
    int rc = LY_SUCCESS;
    struct stat st;
    char *new_dir = NULL;
    uint32_t i;
    LY_ARRAY_COUNT_TYPE u;
    struct lys_module *mod;

    LY_CHECK_ARG_RET(ctx, ctx, LY_EINVAL);

    if (!search_dir) {
        /* fine, ignore */
        goto cleanup;
    }

    new_dir = realpath(search_dir, NULL);
    if (!new_dir) {
        LOGERR(ctx, LY_ESYS, "Unable to use search directory \"%s\" (%s).", search_dir, strerror(errno)),
        rc = LY_EINVAL;
        goto cleanup;
    }
    if (strcmp(search_dir, new_dir)) {
        LOGVRB("Search directory string \"%s\" canonized to \"%s\".", search_dir, new_dir);
    }

    if (access(new_dir, R_OK | X_OK)) {
        LOGERR(ctx, LY_ESYS, "Unable to fully access search directory \"%s\" (%s).", new_dir, strerror(errno));
        rc = LY_EINVAL;
        goto cleanup;
    }
    if (stat(new_dir, &st)) {
        LOGERR(ctx, LY_ESYS, "stat() failed for \"%s\" (%s).", new_dir, strerror(errno));
        rc = LY_ESYS;
        goto cleanup;
    }
    if (!S_ISDIR(st.st_mode)) {
        LOGERR(ctx, LY_ESYS, "Given search directory \"%s\" is not a directory.", new_dir);
        rc = LY_EINVAL;
        goto cleanup;
    }

    /* avoid path duplication */
    for (i = 0; i < ctx->search_paths.count; ++i) {
        if (!strcmp(new_dir, ctx->search_paths.objs[i])) {
            rc = LY_EEXIST;
            goto cleanup;
        }
    }
    if (ly_set_add(&ctx->search_paths, new_dir, 1, NULL)) {
        rc = LY_EMEM;
        goto cleanup;
    }

    /* new searchdir - reset latests flags (possibly new revisions available) */
    for (i = 0; i < ctx->list.count; ++i) {
        mod = ctx->list.objs[i];

        mod->latest_revision &= ~LYS_MOD_LATEST_SEARCHDIRS;
        if (mod->parsed && mod->parsed->includes) {
            for (u = 0; u < LY_ARRAY_COUNT(mod->parsed->includes); ++u) {
                mod->parsed->includes[u].submodule->latest_revision &= ~LYS_MOD_LATEST_SEARCHDIRS;
            }
        }
    }

cleanup:
    if (rc) {
        free(new_dir);
    }
    return rc;
}